

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c-writer.cc
# Opt level: O0

void __thiscall
wabt::(anonymous_namespace)::CWriter::
Write<std::__cxx11::string,char_const(&)[13],wabt::(anonymous_namespace)::OpenBrace>
          (CWriter *this,basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *t,
          char (*u) [13],OpenBrace *args)

{
  string_view local_48;
  string_view local_38;
  OpenBrace *local_28;
  OpenBrace *args_local;
  char (*u_local) [13];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *t_local;
  CWriter *this_local;
  
  local_28 = args;
  args_local = (OpenBrace *)u;
  u_local = (char (*) [13])t;
  t_local = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this;
  local_38 = (string_view)std::__cxx11::string::operator_cast_to_basic_string_view((string *)t);
  anon_unknown_0::CWriter::Write((CWriter *)this,local_38);
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            (&local_48,(char *)args_local);
  anon_unknown_0::CWriter::Write((CWriter *)this,local_48);
  anon_unknown_0::CWriter::Write((CWriter *)this);
  return;
}

Assistant:

void Write(T&& t, U&& u, Args&&... args) {
    Write(std::forward<T>(t));
    Write(std::forward<U>(u));
    Write(std::forward<Args>(args)...);
  }